

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprog.c
# Opt level: O2

void pulse_prog_imp(CHAR_DATA *mob)

{
  CHAR_DATA *victim;
  CHAR_DATA *ch;
  OBJ_DATA *obj;
  bool bVar1;
  int iVar2;
  CHAR_DATA **ppCVar3;
  OBJ_DATA **ppOVar4;
  
  iVar2 = number_percent();
  if ((iVar2 < 0x29) && (mob->position == 8)) {
    ppCVar3 = &mob->in_room->people;
    while (victim = *ppCVar3, victim != (CHAR_DATA *)0x0) {
      iVar2 = number_percent();
      if (0x61 < iVar2) {
        ch = mob->master;
        if (ch == (CHAR_DATA *)0x0) {
          if (victim != mob) goto LAB_0033b0aa;
        }
        else if (((victim != ch) && (bVar1 = is_safe_new(ch,victim,false), victim != mob)) &&
                (!bVar1)) {
LAB_0033b0aa:
          ppOVar4 = &victim->carrying;
          while (obj = *ppOVar4, obj != (OBJ_DATA *)0x0) {
            if ((obj->wear_loc == -1) && (bVar1 = can_see_obj(mob,obj), bVar1)) {
              iVar2 = number_percent();
              if (iVar2 < 0x4c) {
                obj_from_char(obj);
                obj_to_char(obj,mob);
                return;
              }
              bVar1 = is_npc(victim);
              if (!bVar1) {
                return;
              }
              multi_hit(victim,mob,-1);
              return;
            }
            ppOVar4 = &obj->next_content;
          }
        }
      }
      ppCVar3 = &victim->next_in_room;
    }
  }
  return;
}

Assistant:

void pulse_prog_imp(CHAR_DATA *mob)
{
	CHAR_DATA *victim;
	OBJ_DATA *steal;

	if (number_percent() > 40 || mob->position != POS_STANDING)
		return;

	for (victim = mob->in_room->people; victim; victim = victim->next_in_room)
	{
		if (number_percent() < 98
			|| (mob->master && (victim == mob->master || is_safe_new(mob->master, victim, false)))
			|| mob == victim)
		{
			continue;
		}

		for (steal = victim->carrying; steal; steal = steal->next_content)
		{
			if (steal->wear_loc == WEAR_NONE && can_see_obj(mob, steal))
			{
				if (number_percent() > 75)
				{
					if (is_npc(victim))
						multi_hit(victim, mob, TYPE_UNDEFINED);
				}
				else
				{
					obj_from_char(steal);
					obj_to_char(steal, mob);
				}

				return;
			}
		}
	}
}